

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O3

void G_AddViewAngle(int yaw)

{
  float fVar1;
  int iVar2;
  
  if (gamestate != GS_TITLELEVEL) {
    iVar2 = yaw << 0x10;
    if ((((&DAT_017e1e48)[(long)consoleplayer * 0x2a0] != '\x01') &&
        (*(long *)(&DAT_017e1f10 + (long)consoleplayer * 0x2a0) != 0)) &&
       (fVar1 = *(float *)(*(long *)(&DAT_017e1f10 + (long)consoleplayer * 0x2a0) + 0x598),
       0.0 < fVar1)) {
      iVar2 = (int)(fVar1 * (float)iVar2);
    }
    LocalViewAngle = LocalViewAngle - iVar2;
    if (iVar2 != 0) {
      LocalKeyboardTurner = smooth_mouse.Value;
    }
  }
  return;
}

Assistant:

void G_AddViewAngle (int yaw)
{
	if (gamestate == GS_TITLELEVEL)
	{
		return;
	}
	yaw <<= 16;
	if (players[consoleplayer].playerstate != PST_DEAD &&	// No adjustment while dead.
		players[consoleplayer].ReadyWeapon != NULL &&		// No adjustment if no weapon.
		players[consoleplayer].ReadyWeapon->FOVScale > 0)	// No adjustment if it is non-positive.
	{
		yaw = int(yaw * players[consoleplayer].ReadyWeapon->FOVScale);
	}
	LocalViewAngle -= yaw;
	if (yaw != 0)
	{
		LocalKeyboardTurner = smooth_mouse;
	}
}